

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_AbsentExtension_Test::TestBody
          (ExtensionSetTest_AbsentExtension_Test *this)

{
  bool bVar1;
  RepeatedFieldType *this_00;
  pointer this_01;
  char *pcVar2;
  ConstType this_02;
  AssertHelper local_a8;
  Message local_a0;
  int32_t local_98;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  Message local_70;
  int local_68 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  TestAllExtensions message;
  ExtensionSetTest_AbsentExtension_Test *this_local;
  
  message.field_0._24_8_ = this;
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_40);
  this_00 = proto2_unittest::TestAllExtensions::
            MutableRepeatedExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                      ((TestAllExtensions *)local_40,
                       (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                        *)proto2_unittest::repeated_nested_message_extension);
  this_01 = RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>::Add(this_00);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(this_01,0x7b);
  local_68[1] = 1;
  local_68[0] = proto2_unittest::TestAllExtensions::
                ExtensionSize<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false,google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>>
                          ((TestAllExtensions *)local_40,
                           (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                            *)proto2_unittest::repeated_nested_message_extension);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_60,"1",
             "message.ExtensionSize(unittest::repeated_nested_message_extension)",local_68 + 1,
             local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x496,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_94 = 0x7b;
    this_02 = proto2_unittest::TestAllExtensions::
              GetExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                        ((TestAllExtensions *)local_40,
                         (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                          *)proto2_unittest::repeated_nested_message_extension,0);
    local_98 = proto2_unittest::TestAllTypes_NestedMessage::bb(this_02);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_90,"123",
               "message.GetExtension(unittest::repeated_nested_message_extension, 0) .bb()",
               &local_94,&local_98);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x499,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_40);
  return;
}

Assistant:

TEST(ExtensionSetTest, AbsentExtension) {
  unittest::TestAllExtensions message;
  message.MutableRepeatedExtension(unittest::repeated_nested_message_extension)
      ->Add()
      ->set_bb(123);
  ASSERT_EQ(1,
            message.ExtensionSize(unittest::repeated_nested_message_extension));
  EXPECT_EQ(123,
            message.GetExtension(unittest::repeated_nested_message_extension, 0)
                .bb());
}